

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O2

void __thiscall
ST::string::_set_utf8(string *this,char *utf8,size_t size,utf_validation_t validation)

{
  buffer<char> local_48;
  
  if (0xfffffff < size) {
    _ST_PRIVATE::assert_handler
              ("/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_string.h"
               ,0x5e,"String data buffer is too large");
  }
  if (utf8 == (char *)0x0) {
    local_48.m_chars = local_48.m_data;
    local_48.m_size = 0;
    local_48.m_data[0] = '\0';
    local_48.m_data[1] = '\0';
    local_48.m_data[2] = '\0';
    local_48.m_data[3] = '\0';
    local_48.m_data[4] = '\0';
    local_48.m_data[5] = '\0';
    local_48.m_data[6] = '\0';
    local_48.m_data[7] = '\0';
    local_48.m_data[8] = '\0';
    local_48.m_data[9] = '\0';
    local_48.m_data[10] = '\0';
    local_48.m_data[0xb] = '\0';
    local_48.m_data[0xc] = '\0';
    local_48.m_data[0xd] = '\0';
    local_48.m_data[0xe] = '\0';
    local_48.m_data[0xf] = '\0';
    buffer<char>::operator=(&this->m_buffer,&local_48);
  }
  else {
    buffer<char>::buffer(&local_48,utf8,size);
    set(this,&local_48,validation);
  }
  buffer<char>::~buffer(&local_48);
  return;
}

Assistant:

void _set_utf8(const char *utf8, size_t size, utf_validation_t validation)
        {
            ST_ASSERT(size < ST_HUGE_BUFFER_SIZE, "String data buffer is too large");

            if (!utf8) {
                m_buffer = char_buffer();
                return;
            }

            set(char_buffer(utf8, size), validation);
        }